

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStdio.cpp
# Opt level: O2

void __thiscall adios2::transport::FileStdio::SeekToEnd(FileStdio *this)

{
  int iVar1;
  allocator local_8b;
  allocator local_8a;
  allocator local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string local_48;
  string local_28;
  
  WaitForOpen(this);
  iVar1 = fseek((FILE *)this->m_File,0,2);
  if (iVar1 == -1) {
    std::__cxx11::string::string((string *)&local_28,"Toolkit",&local_89);
    std::__cxx11::string::string((string *)&local_48,"transport::file::FileStdio",&local_8a);
    std::__cxx11::string::string((string *)&local_68,"SeekToEnd",&local_8b);
    std::operator+(&local_88,"couldn\'t seek to the end of file ",&(this->super_Transport).m_Name);
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_28,&local_48,&local_68,&local_88,-1);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_28);
  }
  return;
}

Assistant:

void FileStdio::SeekToEnd()
{
    WaitForOpen();
    const auto status = std::fseek(m_File, 0, SEEK_END);
    if (status == -1)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileStdio", "SeekToEnd",
                                              "couldn't seek to the end of file " + m_Name);
    }
}